

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToHalfPass::IsArithmetic(ConvertToHalfPass *this,Instruction *inst)

{
  IRContext *this_00;
  bool bVar1;
  undefined4 in_EAX;
  uint32_t uVar2;
  const_iterator cVar3;
  FeatureManager *pFVar4;
  const_iterator cVar5;
  uint uVar6;
  uint32_t local_28;
  Op local_24;
  
  _local_28 = CONCAT44(inst->opcode_,in_EAX);
  cVar3 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::ConvertToHalfPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->target_ops_core_)._M_h,&local_24);
  bVar1 = true;
  if (cVar3.super__Node_iterator_base<spv::Op,_false>._M_cur == (__node_type *)0x0) {
    if (inst->opcode_ == OpExtInst) {
      uVar2 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar2 = (uint)inst->has_result_id_;
      }
      uVar2 = Instruction::GetSingleWordOperand(inst,uVar2);
      this_00 = (this->super_Pass).context_;
      pFVar4 = (this_00->feature_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
               .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      if (pFVar4 == (FeatureManager *)0x0) {
        IRContext::AnalyzeFeatures(this_00);
        pFVar4 = (this_00->feature_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                 .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
      }
      if (uVar2 == pFVar4->extinst_importid_GLSLstd450_) {
        uVar6 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar6 = (uint)inst->has_result_id_;
        }
        uVar2 = Instruction::GetSingleWordOperand(inst,uVar6 + 1);
        _local_28 = CONCAT44(local_24,uVar2);
        cVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->target_ops_450_)._M_h,&local_28);
        return cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConvertToHalfPass::IsArithmetic(Instruction* inst) {
  return target_ops_core_.count(inst->opcode()) != 0 ||
         (inst->opcode() == spv::Op::OpExtInst &&
          inst->GetSingleWordInOperand(0) ==
              context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
          target_ops_450_.count(inst->GetSingleWordInOperand(1)) != 0);
}